

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercomm.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  QueuePolicy *q_policy;
  void *b;
  Link *pLVar2;
  ConsumerBlock *this;
  int iVar3;
  DIY_MPI_Comm DVar4;
  int iVar5;
  _Any_data local_1878;
  code *local_1868;
  code *local_1860;
  communicator local;
  communicator world;
  _Any_data local_1828;
  code *local_1818;
  _Any_data local_1808;
  code *local_17f8;
  _Any_data local_17e8;
  code *local_17d8;
  MPI_Comm intercomm;
  environment env;
  _Any_data local_17b8;
  code *local_17a8;
  undefined8 uStack_17a0;
  _Any_data local_1798;
  code *local_1788;
  undefined8 uStack_1780;
  _Any_data local_1778;
  code *local_1768;
  undefined8 uStack_1760;
  _Any_data local_1758;
  code *local_1748;
  undefined8 uStack_1740;
  communicator local_1730;
  _Any_data local_1718;
  code *local_1708;
  code *local_1700;
  _Any_data local_16f8;
  code *local_16e8;
  code *local_16e0;
  _Any_data local_16d8;
  code *local_16c8;
  code *local_16c0;
  _Any_data local_16b8;
  code *local_16a8;
  code *local_16a0;
  _Any_data local_1698;
  code *local_1688;
  code *local_1680;
  _Any_data local_1678;
  code *local_1668;
  code *local_1660;
  Master master;
  
  local_1828._0_4_ = argc;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)argv;
  MPI_Init_thread(&local_1828,&master,1,&env);
  world.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  world.rank_ = 0;
  world.size_ = 1;
  world.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(world.comm_.data);
  srand(world.rank_);
  iVar1 = world.rank_;
  iVar5 = world.size_ / 2;
  MPI_Comm_split(world.comm_.data,world.rank_ < iVar5,0,&master);
  local.comm_.data =
       (MPI_Comm)
       master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local.rank_ = 0;
  local.size_ = 1;
  local.owner_ = true;
  DVar4.data = (MPI_Comm)&ompi_mpi_comm_null;
  if (master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)&ompi_mpi_comm_null) {
    MPI_Comm_rank(master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,&local.rank_);
    MPI_Comm_size(local.comm_.data);
    DVar4 = local.comm_;
  }
  iVar3 = 0;
  if (iVar1 < iVar5) {
    iVar3 = world.size_ / 2;
  }
  MPI_Intercomm_create(DVar4.data,0,world.comm_.data,iVar3,0,&intercomm);
  diy::mpi::communicator::communicator(&local_1730,intercomm);
  local_1748 = (code *)0x0;
  uStack_1740 = 0;
  local_1758._M_unused._M_object = (void *)0x0;
  local_1758._8_8_ = 0;
  local_1778._M_unused._M_object = (void *)0x0;
  local_1778._8_8_ = 0;
  local_1768 = (code *)0x0;
  uStack_1760 = 0;
  local_1798._M_unused._M_object = (void *)0x0;
  local_1798._8_8_ = 0;
  local_1788 = (code *)0x0;
  uStack_1780 = 0;
  local_17b8._M_unused._M_object = (void *)0x0;
  local_17b8._8_8_ = 0;
  local_17a8 = (code *)0x0;
  uStack_17a0 = 0;
  q_policy = (QueuePolicy *)operator_new(0x10);
  q_policy->_vptr_QueuePolicy = (_func_int **)&PTR_unload_incoming_0013c690;
  q_policy[1]._vptr_QueuePolicy = (_func_int **)0x1000;
  diy::Master::Master(&master,&local_1730,1,-1,(CreateBlock *)&local_1758,
                      (DestroyBlock *)&local_1778,(ExternalStorage *)0x0,(SaveBlock *)&local_1798,
                      (LoadBlock *)&local_17b8,q_policy);
  if (local_17a8 != (code *)0x0) {
    (*local_17a8)(&local_17b8,&local_17b8,__destroy_functor);
  }
  if (local_1788 != (code *)0x0) {
    (*local_1788)(&local_1798,&local_1798,__destroy_functor);
  }
  if (local_1768 != (code *)0x0) {
    (*local_1768)(&local_1778,&local_1778,__destroy_functor);
  }
  if (local_1748 != (code *)0x0) {
    (*local_1748)(&local_1758,&local_1758,__destroy_functor);
  }
  diy::mpi::communicator::~communicator(&local_1730);
  iVar3 = local.rank_;
  if (iVar1 < iVar5) {
    b = operator_new(1);
    pLVar2 = (Link *)operator_new(0x20);
    (pLVar2->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__0013c850;
    (pLVar2->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pLVar2->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pLVar2->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    diy::Master::add(&master,iVar3,b,pLVar2);
    local_16b8._M_unused._M_object = (void *)0x0;
    local_16b8._8_8_ = 0;
    local_16a0 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_invoke;
    local_16a8 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
    local_1698._M_unused._M_object = (void *)0x0;
    local_1698._8_8_ = 0;
    local_1680 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_invoke;
    local_1688 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
    local_1678._M_unused._M_object = (void *)0x0;
    local_1678._8_8_ = 0;
    local_1660 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_invoke;
    local_1668 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
    local_1878._8_8_ = 0;
    local_1878._M_unused._M_object = &local;
    local_1860 = std::
                 _Function_handler<bool_(ProducerBlock_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/simple/intercomm.cpp:44:26)>
                 ::_M_invoke;
    local_1868 = std::
                 _Function_handler<bool_(ProducerBlock_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/simple/intercomm.cpp:44:26)>
                 ::_M_manager;
    std::function<char_*(int,_unsigned_long)>::function
              ((function<char_*(int,_unsigned_long)> *)&local_1828,
               (function<char_*(int,_unsigned_long)> *)&local_16b8);
    std::function<void_(const_char_*)>::function
              ((function<void_(const_char_*)> *)&local_1808,
               (function<void_(const_char_*)> *)&local_1698);
    std::function<void_(char_*,_const_char_*,_unsigned_long)>::function
              ((function<void_(char_*,_const_char_*,_unsigned_long)> *)&local_17e8,
               (function<void_(char_*,_const_char_*,_unsigned_long)> *)&local_1678);
    diy::Master::iexchange_<ProducerBlock>
              (&master,(ICallback<ProducerBlock> *)&local_1878,(MemoryManagement *)&local_1828);
    if (local_17d8 != (code *)0x0) {
      (*local_17d8)(&local_17e8,&local_17e8,__destroy_functor);
    }
    if (local_17f8 != (code *)0x0) {
      (*local_17f8)(&local_1808,&local_1808,__destroy_functor);
    }
    if (local_1818 != (code *)0x0) {
      (*local_1818)(&local_1828,&local_1828,__destroy_functor);
    }
    if (local_1868 != (code *)0x0) {
      (*local_1868)(&local_1878,&local_1878,__destroy_functor);
    }
    if (local_1668 != (code *)0x0) {
      (*local_1668)(&local_1678,&local_1678,__destroy_functor);
    }
    if (local_1688 != (code *)0x0) {
      (*local_1688)(&local_1698,&local_1698,__destroy_functor);
    }
    if (local_16a8 != (code *)0x0) {
      (*local_16a8)(&local_16b8,&local_16b8,__destroy_functor);
    }
  }
  else {
    this = (ConsumerBlock *)operator_new(0x20);
    ConsumerBlock::ConsumerBlock(this,world.size_ / 2);
    pLVar2 = (Link *)operator_new(0x20);
    (pLVar2->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__0013c850;
    (pLVar2->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pLVar2->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pLVar2->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    diy::Master::add(&master,iVar3,this,pLVar2);
    local_1718._M_unused._M_object = (void *)0x0;
    local_1718._8_8_ = 0;
    local_1700 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_invoke;
    local_1708 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
    local_16f8._M_unused._M_object = (void *)0x0;
    local_16f8._8_8_ = 0;
    local_16e0 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_invoke;
    local_16e8 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
    local_16d8._M_unused._M_object = (void *)0x0;
    local_16d8._8_8_ = 0;
    local_16c0 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_invoke;
    local_16c8 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
    local_1878._8_8_ = 0;
    local_1878._M_unused._M_object = &local;
    local_1860 = std::
                 _Function_handler<bool_(ConsumerBlock_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/simple/intercomm.cpp:68:26)>
                 ::_M_invoke;
    local_1868 = std::
                 _Function_handler<bool_(ConsumerBlock_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/simple/intercomm.cpp:68:26)>
                 ::_M_manager;
    std::function<char_*(int,_unsigned_long)>::function
              ((function<char_*(int,_unsigned_long)> *)&local_1828,
               (function<char_*(int,_unsigned_long)> *)&local_1718);
    std::function<void_(const_char_*)>::function
              ((function<void_(const_char_*)> *)&local_1808,
               (function<void_(const_char_*)> *)&local_16f8);
    std::function<void_(char_*,_const_char_*,_unsigned_long)>::function
              ((function<void_(char_*,_const_char_*,_unsigned_long)> *)&local_17e8,
               (function<void_(char_*,_const_char_*,_unsigned_long)> *)&local_16d8);
    diy::Master::iexchange_<ConsumerBlock>
              (&master,(ICallback<ConsumerBlock> *)&local_1878,(MemoryManagement *)&local_1828);
    if (local_17d8 != (code *)0x0) {
      (*local_17d8)(&local_17e8,&local_17e8,__destroy_functor);
    }
    if (local_17f8 != (code *)0x0) {
      (*local_17f8)(&local_1808,&local_1808,__destroy_functor);
    }
    if (local_1818 != (code *)0x0) {
      (*local_1818)(&local_1828,&local_1828,__destroy_functor);
    }
    if (local_1868 != (code *)0x0) {
      (*local_1868)(&local_1878,&local_1878,__destroy_functor);
    }
    if (local_16c8 != (code *)0x0) {
      (*local_16c8)(&local_16d8,&local_16d8,__destroy_functor);
    }
    if (local_16e8 != (code *)0x0) {
      (*local_16e8)(&local_16f8,&local_16f8,__destroy_functor);
    }
    if (local_1708 != (code *)0x0) {
      (*local_1708)(&local_1718,&local_1718,__destroy_functor);
    }
  }
  diy::Master::~Master(&master);
  diy::mpi::communicator::~communicator(&local);
  diy::mpi::communicator::~communicator(&world);
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment   env(argc, argv); // equivalent of MPI_Init(argc, argv)/MPI_Finalize()
    diy::mpi::communicator  world;           // equivalent of MPI_COMM_WORLD

    srand(world.rank());

    bool producer = world.rank() < world.size() / 2;
    diy::mpi::communicator  local = world.split(producer);

    MPI_Comm intercomm;
    MPI_Intercomm_create(local, 0, world, /* remote_leader = */ producer ? world.size() / 2 : 0, /* tag = */ 0, &intercomm);

    diy::Master master(intercomm);
    if (producer)
    {
        master.add(local.rank(), new ProducerBlock, new diy::Link);

        // respond to queries
        master.iexchange([&local](ProducerBlock*, const diy::Master::ProxyWithLink& cp) -> bool
        {
            for (auto& x : *cp.incoming())
            {
                int   gid   = x.first;
                auto& queue = x.second;
                while (queue)
                {
                    int query;
                    diy::load(queue, query);

                    int response = query * local.rank();
                    cp.enqueue(diy::BlockID { gid, gid }, response);

                    fmt::print("[{} producer] received {} from {}; responded {}\n", local.rank(), query, gid, response);
                }
            }

            return true;       // done; producer never has any local work
        });
    } else
    {
        master.add(local.rank(), new ConsumerBlock(world.size()/2), new diy::Link);

        master.iexchange([&local](ConsumerBlock* b, const diy::Master::ProxyWithLink& cp) -> bool
        {
            // schedule 5 queries at a time
            for (int i = 0; i < 5 && b->cur < b->queries.size(); ++i, ++b->cur)
            {
                int target = b->queries[b->cur].first;
                int query  = b->queries[b->cur].second;
                cp.enqueue(diy::BlockID { target, target }, query);

                fmt::print("[{} consumer] Enqueueing {} to {}\n", local.rank(), query, target);
            }

            for (auto& x : *cp.incoming())
            {
                int   gid   = x.first;
                auto& queue = x.second;
                while (queue)
                {
                    int response;
                    diy::load(queue, response);
                    fmt::print("[{} consumer] Received {} from {}\n", local.rank(), response, gid);
                }
            }

            return b->cur == b->queries.size();
        });
    }
}